

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

List<String> * Process::environment(void)

{
  vector<String,_std::allocator<String>_> *in_RDI;
  undefined8 *puVar1;
  string local_40 [32];
  
  puVar1 = _environ;
  (in_RDI->super__Vector_base<String,_std::allocator<String>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (in_RDI->super__Vector_base<String,_std::allocator<String>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (in_RDI->super__Vector_base<String,_std::allocator<String>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  for (; (char *)*puVar1 != (char *)0x0; puVar1 = puVar1 + 1) {
    String::String((String *)local_40,(char *)*puVar1,0xffffffffffffffff);
    std::vector<String,_std::allocator<String>_>::emplace_back<String>(in_RDI,(String *)local_40);
    std::__cxx11::string::~string(local_40);
  }
  return (List<String> *)in_RDI;
}

Assistant:

List<String> Process::environment()
{
#ifdef OS_Darwin
    char **cur = *_NSGetEnviron();
#else
    extern char** environ;
    char** cur = environ;
#endif
    List<String> env;
    while (*cur) {
        env.push_back(*cur);
        ++cur;
    }
    return env;
}